

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  bool bVar1;
  int i;
  long lVar2;
  int over;
  uint uVar3;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_verify_cold_2();
  }
  else if (seckey != (uchar *)0x0) {
    lVar2 = 0;
    bVar1 = false;
    uVar3 = 0;
    do {
      uVar3 = (uint)seckey[lVar2] | uVar3 << 8;
      if (0xc < uVar3) {
        bVar1 = true;
        uVar3 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    return (uint)(uVar3 != 0 && !bVar1);
  }
  secp256k1_ec_seckey_verify_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_clear(&sec);
    return ret;
}